

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

ssize_t __thiscall
ControlProtocolState::read(ControlProtocolState *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  bool bVar2;
  __type _Var3;
  unsigned_long *puVar4;
  void *pvVar5;
  long lVar6;
  ControlProtocolState *pCVar7;
  undefined4 in_register_00000034;
  StringRef string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  char *local_150;
  string local_148;
  unsigned_long local_128;
  size_t nl;
  string *errstr_local;
  ControlProtocolState *this_local;
  StringRef buf_local;
  void *P;
  size_t FindBegin;
  char local_c9;
  ControlProtocolState **local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  ControlProtocolState **local_a8;
  undefined1 local_a0 [16];
  char *local_90;
  string *local_88;
  undefined1 *local_80;
  char *local_78;
  ControlProtocolState **local_70;
  ControlProtocolState **local_58;
  unsigned_long local_50 [2];
  char *local_40;
  ControlProtocolState **local_38;
  undefined1 local_30 [16];
  char *local_20;
  ControlProtocolState *local_18;
  undefined1 *local_10;
  
  nl = __nbytes;
  errstr_local = &this->controlID;
  this_local = (ControlProtocolState *)CONCAT44(in_register_00000034,__fd);
  buf_local.Data = (char *)__buf;
  do {
    if (buf_local.Data == (char *)0x0) {
      buf_local.Length._4_4_ = 0;
LAB_001e12d5:
      return (ulong)buf_local.Length._4_4_;
    }
    local_c8 = &this_local;
    local_c9 = '\n';
    FindBegin = 0;
    puVar4 = std::min<unsigned_long>(&FindBegin,(unsigned_long *)&buf_local);
    pcVar1 = (char *)*puVar4;
    if ((pcVar1 < buf_local.Data) &&
       (pvVar5 = memchr(pcVar1 + (long)&this_local->controlID,(int)local_c9,
                        (long)buf_local.Data - (long)pcVar1), pvVar5 != (void *)0x0)) {
      local_c0 = (long)pvVar5 - (long)this_local;
    }
    else {
      local_c0 = 0xffffffffffffffff;
    }
    local_128 = local_c0;
    if (local_c0 == 0xffffffffffffffff) {
      lVar6 = std::__cxx11::string::size();
      if ((char *)this->maxLength < buf_local.Data + lVar6) {
        std::__cxx11::string::clear();
        if (nl != 0) {
          std::__cxx11::string::operator=((string *)nl,"excessive message length");
        }
        buf_local.Length._4_4_ = 0xffffffff;
      }
      else {
        llvm::StringRef::str_abi_cxx11_(&local_148,(StringRef *)&this_local);
        std::__cxx11::string::operator+=((string *)&this->partialMsg,(string *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        buf_local.Length._4_4_ = 0;
      }
      goto LAB_001e12d5;
    }
    local_a8 = &this_local;
    local_b0 = 0;
    local_b8 = local_c0;
    puVar4 = std::min<unsigned_long>(&local_b0,(unsigned_long *)&buf_local);
    local_b0 = *puVar4;
    puVar4 = std::max<unsigned_long>(&local_b0,&local_b8);
    puVar4 = std::min<unsigned_long>(puVar4,(unsigned_long *)&buf_local);
    local_b8 = *puVar4;
    string.Length = (string *)(&(this_local->controlID)._M_dataplus + local_b0);
    local_150 = (char *)(local_b8 - local_b0);
    local_80 = local_a0;
    string.Data = local_150;
    local_158 = string.Length;
    local_90 = local_150;
    local_88 = string.Length;
    llvm::operator+=((llvm *)&this->partialMsg,string.Length,string);
    if ((this->negotiated & 1U) != 0) {
      _Var3 = std::operator==(&this->partialMsg,&this->controlID);
      if (_Var3) {
        this->releaseSeen = true;
      }
      if (nl != 0) {
        std::__cxx11::string::operator=((string *)nl,"bad ID");
      }
      std::__cxx11::string::clear();
      buf_local.Length._4_4_ = 1;
      goto LAB_001e12d5;
    }
    bVar2 = std::operator!=(&this->partialMsg,"llbuild.1");
    if (bVar2) {
      if (nl != 0) {
        std::operator+(&local_178,"unsupported protocol: ",&this->partialMsg);
        std::__cxx11::string::operator=((string *)nl,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
      }
      std::__cxx11::string::clear();
      buf_local.Length._4_4_ = 0xffffffff;
      goto LAB_001e12d5;
    }
    this->negotiated = true;
    std::__cxx11::string::clear();
    local_78 = (char *)(local_128 + 1);
    local_70 = &this_local;
    local_58 = local_70;
    if (buf_local.Data < local_78) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    local_50[1] = 0xffffffffffffffff;
    local_40 = local_78;
    local_38 = local_70;
    puVar4 = std::min<unsigned_long>((unsigned_long *)&local_40,(unsigned_long *)&buf_local);
    local_40 = (char *)*puVar4;
    pCVar7 = (ControlProtocolState *)(local_40 + (long)&(this_local->controlID)._M_dataplus);
    local_50[0] = (long)buf_local.Data - (long)local_40;
    puVar4 = std::min<unsigned_long>(local_50 + 1,local_50);
    buf_local.Data = (char *)*puVar4;
    local_10 = local_30;
    this_local = pCVar7;
    local_20 = buf_local.Data;
    local_18 = pCVar7;
  } while( true );
}

Assistant:

int read(StringRef buf, std::string* errstr = nullptr) {
    while (buf.size()) {
      size_t nl = buf.find('\n');
      if (nl == StringRef::npos) {
        if (partialMsg.size() + buf.size() > maxLength) {
          // protocol fault, msg length exceeded maximum
          partialMsg.clear();
          if (errstr) {
            *errstr = "excessive message length";
          }
          return -1;
        }

        // incomplete msg, store and continue
        partialMsg += buf.str();
        return 0;
      }

      partialMsg += buf.slice(0, nl);

      if (!negotiated) {
        // negotiate protocol version
        if (partialMsg != "llbuild.1") {
          // incompatible protocol version
          if (errstr) {
            *errstr = "unsupported protocol: " + partialMsg;
          }
          partialMsg.clear();
          return -1;
        }
        negotiated = true;
      } else {
        // check for supported control message
        if (partialMsg == controlID) {
          releaseSeen = true;
        }

        // We halt receiving anything after the first control message
        if (errstr) {
          *errstr = "bad ID";
        }
        partialMsg.clear();
        return 1;
      }

      partialMsg.clear();
      buf = buf.drop_front(nl + 1);
    }
    return 0;
  }